

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O2

bool pybind11::array_t<long,_17>::check_(handle h)

{
  _func_bool_PyObject_ptr_PyObject_ptr *p_Var1;
  PyTypeObject *pPVar2;
  bool bVar3;
  npy_api *this;
  handle local_20;
  
  this = detail::npy_api::get();
  bVar3 = detail::npy_api::PyArray_Check_(this,h.m_ptr);
  if (bVar3) {
    p_Var1 = this->PyArray_EquivTypes_;
    pPVar2 = h.m_ptr[3].ob_type;
    detail::npy_format_descriptor<long,_void>::dtype();
    bVar3 = (*p_Var1)((PyObject *)pPVar2,local_20.m_ptr);
    pybind11::object::~object((object *)&local_20);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool check_(handle h) {
        const auto &api = detail::npy_api::get();
        return api.PyArray_Check_(h.ptr())
               && api.PyArray_EquivTypes_(detail::array_proxy(h.ptr())->descr, dtype::of<T>().ptr());
    }